

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# forestdb_dump.cc
# Opt level: O2

int process_file(dump_option *opt)

{
  char *filename;
  fdb_status fVar1;
  int iVar2;
  char *pcVar3;
  char *__format;
  ulong uVar4;
  fdb_kvs_handle *db;
  fdb_file_handle *dbfile;
  fdb_kvs_name_list name_list;
  fdb_kvs_config local_140;
  fdb_config local_128;
  
  filename = opt->dump_file;
  fdb_get_default_config();
  local_128.buffercache_size = 0;
  local_128.flags = 2;
  fVar1 = fdb_open(&dbfile,filename,&local_128);
  if (fVar1 == FDB_RESULT_SUCCESS) {
    if (((opt->one_key == (char *)0x0) && (opt->one_kvs == (char *)0x0)) &&
       (print_header(dbfile->root), opt->print_header_only != false)) {
      return 0;
    }
    fdb_get_default_kvs_config();
    if ((dbfile->root->config).multi_kv_instances == true) {
      fdb_get_kvs_name_list(dbfile,&name_list);
      for (uVar4 = 0; uVar4 < name_list.num_kvs_names; uVar4 = uVar4 + 1) {
        pcVar3 = name_list.kvs_names[uVar4];
        if ((opt->one_kvs == (char *)0x0) || (iVar2 = strcmp(opt->one_kvs,pcVar3), iVar2 == 0)) {
          fVar1 = fdb_kvs_open(dbfile,&db,pcVar3,&local_140);
          if (fVar1 == FDB_RESULT_SUCCESS) {
            pcVar3 = name_list.kvs_names[uVar4];
            if ((db->kvs_config).custom_cmp == (fdb_custom_cmp_variable)0x0) {
              iVar2 = scan_docs(db,opt,pcVar3);
              if ((iVar2 == -1) && (opt->one_kvs != (char *)0x0)) {
                pcVar3 = name_list.kvs_names[uVar4];
                __format = "KV store \'%s\': key not found\n";
                goto LAB_0010449d;
              }
            }
            else {
              __format = "\nUnable to dump KV store %s due to customized comparison function\n";
LAB_0010449d:
              printf(__format,pcVar3);
            }
            fdb_kvs_close(db);
          }
          else {
            printf("\nUnable to open KV store %s\n",name_list.kvs_names[uVar4]);
          }
        }
      }
      fdb_free_kvs_name_list(&name_list);
    }
    else {
      fVar1 = fdb_kvs_open(dbfile,&db,(char *)0x0,&local_140);
      if (fVar1 != FDB_RESULT_SUCCESS) {
        puts("\nUnable to open KV store");
        goto LAB_001043b6;
      }
      putchar(10);
      iVar2 = scan_docs(db,opt,(char *)0x0);
      if (iVar2 == -1) {
        puts("Key not found");
      }
      fdb_kvs_close(db);
    }
    fVar1 = fdb_close(dbfile);
    if (fVar1 == FDB_RESULT_SUCCESS) {
      fdb_shutdown();
      iVar2 = 0;
    }
    else {
      printf("\nUnable to close %s\n",filename);
      iVar2 = -4;
    }
  }
  else {
    printf("\nUnable to open %s\n",filename);
LAB_001043b6:
    iVar2 = -3;
  }
  return iVar2;
}

Assistant:

int process_file(struct dump_option *opt)
{
    int i, ret;
    fdb_file_handle *dbfile;
    fdb_kvs_handle *db;
    fdb_config config;
    fdb_kvs_config kvs_config;
    fdb_kvs_name_list name_list;
    fdb_status fs;
    char *filename = opt->dump_file;

    config = fdb_get_default_config();
    config.buffercache_size = 0;
    config.flags = FDB_OPEN_FLAG_RDONLY;
    fs = fdb_open(&dbfile, filename, &config);
    if (fs != FDB_RESULT_SUCCESS) {
        printf("\nUnable to open %s\n", filename);
        return -3;
    }
    if (!opt->one_key && !opt->one_kvs) {
        // MB-22046: Avoid dumping header for specific kvs or specific key dump
        print_header(dbfile->root);
        if (opt->print_header_only) {
            return 0;
        }
    }

    kvs_config = fdb_get_default_kvs_config();

    if (dbfile->root->config.multi_kv_instances) {
        fdb_get_kvs_name_list(dbfile, &name_list);
        for (i=0; (uint64_t)i<name_list.num_kvs_names; ++i) {
            if (opt->one_kvs &&
                strcmp(opt->one_kvs, name_list.kvs_names[i])) {
                continue;
            }

            fs = fdb_kvs_open(dbfile, &db, name_list.kvs_names[i], &kvs_config);
            if (fs != FDB_RESULT_SUCCESS) {
                printf("\nUnable to open KV store %s\n", name_list.kvs_names[i]);
                continue;
            }
            if (db->kvs_config.custom_cmp) {
                printf("\nUnable to dump KV store %s due to "
                       "customized comparison function\n", name_list.kvs_names[i]);
                fdb_kvs_close(db);
                continue;
            }

            ret = scan_docs(db, opt, name_list.kvs_names[i]);
            if (ret == -1 && opt->one_kvs) {
                // Only print key not found if a specific key is accompanied by
                // a specific kv store.
                // Otherwise scan all kv stores for the same key..
                printf("KV store '%s': key not found\n", name_list.kvs_names[i]);
            }
            fdb_kvs_close(db);
        }

        fdb_free_kvs_name_list(&name_list);
    } else {
        fs = fdb_kvs_open(dbfile, &db, NULL, &kvs_config);
        if (fs != FDB_RESULT_SUCCESS) {
            printf("\nUnable to open KV store\n");
            return -3;
        }

        printf("\n");
        ret = scan_docs(db, opt, NULL);
        if (ret == -1) {
            printf("Key not found\n");
        }
        fdb_kvs_close(db);
    }

    fs = fdb_close(dbfile);
    if (fs != FDB_RESULT_SUCCESS) {
        printf("\nUnable to close %s\n", filename);
        return -4;
    }

    fdb_shutdown();
    return 0;
}